

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::BreakpointEvent>::copyConstruct
          (BasicTypeInfo<dap::BreakpointEvent> *this,void *dst,void *src)

{
  Breakpoint::Breakpoint((Breakpoint *)dst,(Breakpoint *)src);
  *(long *)((long)dst + 0x1f0) = (long)dst + 0x200;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x1f0),*(long *)((long)src + 0x1f0),
             *(long *)((long)src + 0x1f8) + *(long *)((long)src + 0x1f0));
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }